

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_value.hpp
# Opt level: O1

value_ptr __thiscall
pstore::dump::details::default_make_value<unsigned_short_const&>(details *this,unsigned_short *t)

{
  ushort uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  value_ptr vVar2;
  
  uVar1 = *t;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001f1170;
  this_00[1]._M_use_count = 0;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)&PTR__number_base_001f54a0;
  this_00[1]._M_use_count = number_base::default_base_;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)&PTR__number_base_001f5740;
  this_00[2]._vptr__Sp_counted_base = (_func_int **)(ulong)uVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)this = this_00 + 1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = this_00;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = 2;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  vVar2.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  vVar2.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (value_ptr)vVar2.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline value_ptr default_make_value (T const & t) {
                return make_value (t);
            }